

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O3

int Min_CubeCheck(Min_Cube_t *pCube)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  
  uVar1 = *(uint *)&pCube->field_0x8 & 0x3ff;
  if (uVar1 != 0) {
    bVar2 = 0;
    uVar3 = 0;
    do {
      if ((pCube->uData[uVar3 >> 4] >> (bVar2 & 0x1e) & 3) == 0) {
        return 0;
      }
      uVar3 = uVar3 + 1;
      bVar2 = bVar2 + 2;
    } while (uVar1 != uVar3);
  }
  return 1;
}

Assistant:

int Min_CubeCheck( Min_Cube_t * pCube )
{
    int i;
    for ( i = 0; i < (int)pCube->nVars; i++ )
        if ( Min_CubeGetVar( pCube, i ) == 0 )
            return 0;
    return 1;
}